

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentBG.cpp
# Opt level: O2

void __thiscall
AgentBG::AgentBG(AgentBG *this,PlanningUnitDecPOMDPDiscrete *pu,Index id,QAV<PerseusBGPlanner> *QBG)

{
  DecPOMDPDiscreteInterface *pDVar1;
  int iVar2;
  BayesianGameIdenticalPayoff *this_00;
  undefined4 extraout_var;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nrActions;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nrTypes;
  JointPolicyPureVector *this_01;
  
  (this->super_AgentDelayedSharedObservations).super_AgentDecPOMDPDiscrete.super_SimulationAgent.
  _m_id = id;
  (this->super_AgentDelayedSharedObservations).super_AgentDecPOMDPDiscrete.super_SimulationAgent.
  _m_verbose = false;
  (this->super_AgentDelayedSharedObservations).super_AgentDecPOMDPDiscrete._m_pu = pu;
  (this->super_AgentDelayedSharedObservations).super_AgentDecPOMDPDiscrete.super_SimulationAgent.
  _vptr_SimulationAgent = (_func_int **)&PTR__AgentBG_005df3c0;
  this->_m_QBGstationary = QBG;
  this->_m_QBGnonStationary = (QAV<PerseusBGNSPlanner> *)0x0;
  this->_m_t = 0;
  JointBeliefSparse::JointBeliefSparse(&this->_m_prevJB);
  (this->_m_prevJoIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_prevJoIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_prevJaIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_prevJaIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_prevJaIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_aIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_aIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_aIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_oIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_oIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_oIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_prevJoIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_prevJoIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_prevJoIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_prevJaIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_prevJaIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = (BayesianGameIdenticalPayoff *)operator_new(0xe8);
  iVar2 = (*(pu->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[6])(pu);
  pDVar1 = pu->_m_DecPOMDP;
  nrActions = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
              (**(code **)(*(long *)((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb8))
                          + 0x58))((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb8));
  pDVar1 = pu->_m_DecPOMDP;
  nrTypes = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
            (**(code **)(*(long *)((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb8)) +
                        0xb8))((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb8));
  BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff
            (this_00,CONCAT44(extraout_var,iVar2),nrActions,nrTypes,false);
  this->_m_bgip = this_00;
  this_01 = (JointPolicyPureVector *)operator_new(0x98);
  JointPolicyPureVector::JointPolicyPureVector
            (this_01,(Interface_ProblemToPolicyDiscretePure *)this_00);
  this->_m_jpol = this_01;
  return;
}

Assistant:

AgentBG::AgentBG(const PlanningUnitDecPOMDPDiscrete *pu, Index id,
                 QAV<PerseusBGPlanner> *QBG) :
    AgentDelayedSharedObservations(pu,id),
    _m_QBGstationary(QBG),
    _m_QBGnonStationary(0),
    _m_t(0)
{
    _m_bgip=new BayesianGameIdenticalPayoff(pu->GetNrAgents(),
                                            pu->GetDPOMDPD()->GetNrActions(), 
                                            pu->GetDPOMDPD()->
                                            GetNrObservations());
    _m_jpol=new JointPolicyPureVector(_m_bgip);
#if DEBUG_AgentBG
    cout << GetIndex() << " " <<_m_jpol->SoftPrint() << endl;
#endif
}